

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

CatalogEntryLookup * __thiscall
duckdb::Catalog::TryLookupEntryInternal
          (CatalogEntryLookup *__return_storage_ptr__,Catalog *this,CatalogTransaction transaction,
          string *schema,EntryLookupInfo *lookup_info)

{
  int iVar1;
  undefined4 extraout_var;
  SchemaCatalogEntry *pSVar2;
  undefined4 extraout_var_00;
  optional_ptr<duckdb::BoundAtClause,_true> at_clause_p;
  allocator local_61;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> schema_entry;
  EntryLookupInfo schema_lookup;
  
  if ((lookup_info->at_clause).ptr == (BoundAtClause *)0x0) {
    at_clause_p.ptr = (BoundAtClause *)0x0;
  }
  else {
    iVar1 = (*this->_vptr_Catalog[0x17])(this);
    if ((char)iVar1 == '\0') {
      (__return_storage_ptr__->schema).ptr = (SchemaCatalogEntry *)0x0;
      (__return_storage_ptr__->entry).ptr = (CatalogEntry *)0x0;
      ::std::__cxx11::string::string
                ((string *)&schema_lookup,"Catalog type does not support time travel",&local_61);
      BinderException::BinderException((BinderException *)&schema_entry,(string *)&schema_lookup);
      ErrorData::ErrorData(&__return_storage_ptr__->error,(exception *)&schema_entry);
      ::std::runtime_error::~runtime_error((runtime_error *)&schema_entry);
      ::std::__cxx11::string::~string((string *)&schema_lookup);
      return __return_storage_ptr__;
    }
    at_clause_p.ptr = (lookup_info->at_clause).ptr;
  }
  EntryLookupInfo::EntryLookupInfo
            (&schema_lookup,SCHEMA_ENTRY,schema,at_clause_p,
             (QueryErrorContext)(lookup_info->error_context).query_location.index);
  iVar1 = (*this->_vptr_Catalog[8])(this,&schema_lookup,1);
  schema_entry.ptr = (SchemaCatalogEntry *)CONCAT44(extraout_var,iVar1);
  if (schema_entry.ptr == (SchemaCatalogEntry *)0x0) {
    (__return_storage_ptr__->schema).ptr = (SchemaCatalogEntry *)0x0;
    (__return_storage_ptr__->entry).ptr = (CatalogEntry *)0x0;
  }
  else {
    pSVar2 = optional_ptr<duckdb::SchemaCatalogEntry,_true>::operator->(&schema_entry);
    iVar1 = (*(pSVar2->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x1c])
                      (pSVar2,lookup_info);
    (__return_storage_ptr__->schema).ptr = schema_entry.ptr;
    if ((CatalogEntry *)CONCAT44(extraout_var_00,iVar1) == (CatalogEntry *)0x0) {
      (__return_storage_ptr__->entry).ptr = (CatalogEntry *)0x0;
    }
    else {
      (__return_storage_ptr__->entry).ptr = (CatalogEntry *)CONCAT44(extraout_var_00,iVar1);
    }
  }
  ErrorData::ErrorData(&__return_storage_ptr__->error);
  return __return_storage_ptr__;
}

Assistant:

CatalogEntryLookup Catalog::TryLookupEntryInternal(CatalogTransaction transaction, const string &schema,
                                                   const EntryLookupInfo &lookup_info) {
	if (lookup_info.GetAtClause() && !SupportsTimeTravel()) {
		return {nullptr, nullptr, ErrorData(BinderException("Catalog type does not support time travel"))};
	}
	auto schema_lookup = EntryLookupInfo::SchemaLookup(lookup_info, schema);
	auto schema_entry = LookupSchema(transaction, schema_lookup, OnEntryNotFound::RETURN_NULL);
	if (!schema_entry) {
		return {nullptr, nullptr, ErrorData()};
	}
	auto entry = schema_entry->LookupEntry(transaction, lookup_info);
	if (!entry) {
		return {schema_entry, nullptr, ErrorData()};
	}
	return {schema_entry, entry, ErrorData()};
}